

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QMultiMap<int,_QString> __thiscall QFactoryLoader::keyMap(QFactoryLoader *this)

{
  bool bVar1;
  qsizetype qVar2;
  QCborContainerPrivate *value;
  QCborContainerPrivate *defaultValue;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar3;
  QCborValueConstRef QVar4;
  QCborArray *__range2;
  QCborArray *keys;
  QMultiMap<int,_QString> *result;
  QCborValueConstRef key;
  const_iterator __end2;
  const_iterator __begin2;
  int i;
  QList<QCborArray> metaDataList;
  ConstIterator *in_stack_fffffffffffffea8;
  QList<QCborArray> *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  QCborValueConstRef *this_00;
  QCborContainerPrivate *local_120;
  undefined4 in_stack_ffffffffffffff00;
  int iVar5;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  this_01;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  this_02;
  ConstIterator local_48;
  int local_2c;
  QList<QCborArray> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this_01.d.ptr = in_RDI.d.ptr;
  this_02.d.ptr = in_RDI.d.ptr;
  QMultiMap<int,_QString>::QMultiMap((QMultiMap<int,_QString> *)0x445425);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys((QFactoryLoader *)this_02.d.ptr);
  local_2c = 0;
  while (iVar5 = local_2c, qVar2 = QList<QCborArray>::size(&local_28), iVar5 < (int)qVar2) {
    QList<QCborArray>::operator[](in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8);
    local_48.item.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.item.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    cVar3 = QCborArray::begin((QCborArray *)0x4454f7);
    local_48.item.i = cVar3.item.i;
    value = cVar3.item.d;
    local_48.item.d = value;
    QVar4 = (QCborValueConstRef)QCborArray::end((QCborArray *)0x445539);
    while( true ) {
      this_00 = (QCborValueConstRef *)QVar4.i;
      local_120 = QVar4.d;
      bVar1 = ::operator!=((ConstIterator *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (!bVar1) break;
      QVar4 = QCborArray::ConstIterator::operator*
                        ((ConstIterator *)in_stack_fffffffffffffeb8._M_node);
      defaultValue = QVar4.d;
      QString::QString((QString *)0x4455d1);
      QCborValueConstRef::toString(this_00,(QString *)defaultValue);
      in_stack_fffffffffffffeb8._M_node =
           (_Base_ptr)
           QMultiMap<int,_QString>::insert
                     ((QMultiMap<int,_QString> *)this_01.d.ptr,
                      (int *)CONCAT44(iVar5,in_stack_ffffffffffffff00),(QString *)value);
      QString::~QString((QString *)0x445628);
      QString::~QString((QString *)0x445635);
      QCborArray::ConstIterator::operator++(&local_48);
      QVar4.i = (qsizetype)this_00;
      QVar4.d = local_120;
    }
    local_2c = local_2c + 1;
  }
  QList<QCborArray>::~QList((QList<QCborArray> *)0x4456fe);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMultiMap<int, QString> QFactoryLoader::keyMap() const
{
    QMultiMap<int, QString> result;
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys)
            result.insert(i, key.toString());
    }
    return result;
}